

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

UBool __thiscall icu_63::ResourceArray::getValue(ResourceArray *this,int32_t i,ResourceValue *value)

{
  ushort uVar1;
  int iVar2;
  _func_int **pp_Var3;
  UBool UVar4;
  uint uVar5;
  
  UVar4 = '\0';
  if ((-1 < i) && (i < this->length)) {
    if (this->items16 == (uint16_t *)0x0) {
      uVar5 = this->items32[(uint)i];
    }
    else {
      pp_Var3 = value[1].super_UObject._vptr_UObject;
      uVar1 = this->items16[(uint)i];
      uVar5 = (uint)uVar1;
      iVar2 = *(int *)((long)pp_Var3 + 0x34);
      if (iVar2 <= (int)(uint)uVar1) {
        uVar5 = ((uint)uVar1 - iVar2) + *(int *)(pp_Var3 + 6);
      }
      uVar5 = uVar5 | 0x60000000;
    }
    *(uint *)&value[2].super_UObject._vptr_UObject = uVar5;
    UVar4 = '\x01';
  }
  return UVar4;
}

Assistant:

UBool icu::ResourceArray::getValue(int32_t i, icu::ResourceValue &value) const {
    if(0 <= i && i < length) {
        icu::ResourceDataValue &rdValue = static_cast<icu::ResourceDataValue &>(value);
        rdValue.setResource(internalGetResource(rdValue.pResData, i));
        return TRUE;
    }
    return FALSE;
}